

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_delay_process_pcm_frames
                    (ma_delay *pDelay,void *pFramesOut,void *pFramesIn,ma_uint32 frameCount)

{
  uint uVar1;
  uint uVar2;
  ma_bool32 mVar3;
  float *pfVar4;
  ma_result mVar5;
  uint uVar6;
  float *pFramesInF32;
  ma_uint32 mVar7;
  float *pFramesOutF32;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  float fVar11;
  
  mVar5 = MA_INVALID_ARGS;
  if (pFramesIn != (void *)0x0 && (pFramesOut != (void *)0x0 && pDelay != (ma_delay *)0x0)) {
    if (frameCount == 0) {
      return MA_SUCCESS;
    }
    uVar1 = (pDelay->config).channels;
    uVar8 = (ulong)uVar1;
    uVar6 = pDelay->cursor;
    uVar2 = pDelay->bufferSizeInFrames;
    mVar7 = 0;
    do {
      if (uVar8 != 0) {
        mVar3 = (pDelay->config).delayStart;
        pfVar4 = pDelay->pBuffer;
        uVar10 = 0;
        do {
          uVar9 = uVar6 * uVar1 + (int)uVar10;
          if (mVar3 == 0) {
            fVar11 = pfVar4[uVar9] * (pDelay->config).decay +
                     *(float *)((long)pFramesIn + uVar10 * 4) * (pDelay->config).dry;
            pfVar4[uVar9] = fVar11;
            *(float *)((long)pFramesOut + uVar10 * 4) = fVar11 * (pDelay->config).wet;
          }
          else {
            *(float *)((long)pFramesOut + uVar10 * 4) = pfVar4[uVar9] * (pDelay->config).wet;
            pfVar4[uVar9] =
                 pfVar4[uVar9] * (pDelay->config).decay +
                 *(float *)((long)pFramesIn + uVar10 * 4) * (pDelay->config).dry;
          }
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
      }
      uVar6 = (uVar6 + 1) % uVar2;
      mVar7 = mVar7 + 1;
      pFramesIn = (void *)((long)pFramesIn + uVar8 * 4);
      pFramesOut = (void *)((long)pFramesOut + uVar8 * 4);
    } while (mVar7 != frameCount);
    pDelay->cursor = uVar6;
    mVar5 = MA_SUCCESS;
  }
  return mVar5;
}

Assistant:

MA_API ma_result ma_delay_process_pcm_frames(ma_delay* pDelay, void* pFramesOut, const void* pFramesIn, ma_uint32 frameCount)
{
    ma_uint32 iFrame;
    ma_uint32 iChannel;
    float* pFramesOutF32 = (float*)pFramesOut;
    const float* pFramesInF32 = (const float*)pFramesIn;

    if (pDelay == NULL || pFramesOut == NULL || pFramesIn == NULL) {
        return MA_INVALID_ARGS;
    }

    for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
        for (iChannel = 0; iChannel < pDelay->config.channels; iChannel += 1) {
            ma_uint32 iBuffer = (pDelay->cursor * pDelay->config.channels) + iChannel;

            if (pDelay->config.delayStart) {
                /* Delayed start. */

                /* Read */
                pFramesOutF32[iChannel] = pDelay->pBuffer[iBuffer] * pDelay->config.wet;

                /* Feedback */
                pDelay->pBuffer[iBuffer] = (pDelay->pBuffer[iBuffer] * pDelay->config.decay) + (pFramesInF32[iChannel] * pDelay->config.dry);
            } else {
                /* Immediate start */

                /* Feedback */
                pDelay->pBuffer[iBuffer] = (pDelay->pBuffer[iBuffer] * pDelay->config.decay) + (pFramesInF32[iChannel] * pDelay->config.dry);

                /* Read */
                pFramesOutF32[iChannel] = pDelay->pBuffer[iBuffer] * pDelay->config.wet;
            }
        }

        pDelay->cursor = (pDelay->cursor + 1) % pDelay->bufferSizeInFrames;

        pFramesOutF32 += pDelay->config.channels;
        pFramesInF32  += pDelay->config.channels;
    }

    return MA_SUCCESS;
}